

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void andres::marray_detail::
     AssignmentOperatorHelper<false,_int,_int,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::execute(View<int,_true,_std::allocator<unsigned_long>_> *from,
              View<int,_false,_std::allocator<unsigned_long>_> *to)

{
  CoordinateOrder CVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  reference piVar5;
  reference piVar6;
  reference piVar7;
  reference piVar8;
  size_t j;
  ulong dimension;
  bool bVar9;
  Marray<int,_std::allocator<unsigned_long>_> m;
  ToIterator itTo;
  undefined1 local_a0 [72];
  iterator local_58;
  
  if (from->data_ == (pointer)0x0) {
    bVar9 = false;
  }
  else {
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(to);
    bVar9 = sVar3 == sVar4;
  }
  Assert<bool>(bVar9);
  dimension = 0;
  while( true ) {
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    if (sVar3 <= dimension) break;
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::shape(from,dimension);
    sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(to,dimension);
    Assert<bool>(sVar3 == sVar4);
    dimension = dimension + 1;
  }
  bVar9 = View<int,true,std::allocator<unsigned_long>>::
          overlaps<int,false,std::allocator<unsigned_long>>
                    ((View<int,true,std::allocator<unsigned_long>> *)from,to);
  if (bVar9) {
    Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
              ((Marray<int,std::allocator<unsigned_long>> *)local_a0,from);
    execute((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0,to);
    Marray<int,_std::allocator<unsigned_long>_>::~Marray
              ((Marray<int,_std::allocator<unsigned_long>_> *)local_a0);
  }
  else {
    View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(from);
    CVar1 = (from->geometry_).coordinateOrder_;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(to);
    if (CVar1 == (to->geometry_).coordinateOrder_) {
      bVar9 = View<int,_true,_std::allocator<unsigned_long>_>::isSimple(from);
      if (bVar9) {
        bVar9 = View<int,_false,_std::allocator<unsigned_long>_>::isSimple(to);
        if (bVar9) {
          memcpy(to->data_,from->data_,(from->geometry_).size_ << 2);
          return;
        }
      }
    }
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    if (sVar3 == 1) {
      piVar5 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)to,0);
      piVar6 = View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)from,0);
      OperateHelperBinary<(unsigned_short)1,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(to,from,piVar5,piVar6);
      return;
    }
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    if (sVar3 == 2) {
      piVar5 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)to,0);
      piVar6 = View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)from,0);
      OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(to,from,piVar5,piVar6);
      return;
    }
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    if (sVar3 == 3) {
      piVar5 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)to,0);
      piVar6 = View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)from,0);
      OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(to,from,piVar5,piVar6);
      return;
    }
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    if (sVar3 == 4) {
      piVar5 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)to,0);
      piVar6 = View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)from,0);
      OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(to,from,piVar5,piVar6);
      return;
    }
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    if (sVar3 == 5) {
      piVar5 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)to,0);
      piVar6 = View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)from,0);
      OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(to,from,piVar5,piVar6);
      return;
    }
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    if (sVar3 == 6) {
      piVar5 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)to,0);
      piVar6 = View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)from,0);
      OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(to,from,piVar5,piVar6);
      return;
    }
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    if (sVar3 == 7) {
      piVar5 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)to,0);
      piVar6 = View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)from,0);
      OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(to,from,piVar5,piVar6);
      return;
    }
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    if (sVar3 == 8) {
      piVar5 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)to,0);
      piVar6 = View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)from,0);
      OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(to,from,piVar5,piVar6);
      return;
    }
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    if (sVar3 == 9) {
      piVar5 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)to,0);
      piVar6 = View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)from,0);
      OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(to,from,piVar5,piVar6);
      return;
    }
    sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    if (sVar3 == 10) {
      piVar5 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)to,0);
      piVar6 = View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)from,0);
      OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(to,from,piVar5,piVar6);
      return;
    }
    View<int,_true,_std::allocator<unsigned_long>_>::begin((const_iterator *)local_a0,from);
    View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_58,to);
    while( true ) {
      bVar9 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a0);
      if (!bVar9) break;
      piVar7 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                         ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a0);
      iVar2 = *piVar7;
      piVar8 = Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&local_58);
      *piVar8 = iVar2;
      Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a0);
      Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&local_58);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_58.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_a0 + 0x18));
  }
  return;
}

Assistant:

static void execute
    (
        const View<TFrom, true, AFrom>& from,
        View<TTo, false, ATo>& to
    )
    {
        typedef typename View<TFrom, true, AFrom>::const_iterator FromIterator;
        typedef typename View<TTo, false, ATo>::iterator ToIterator;
        if(!MARRAY_NO_ARG_TEST) {
            Assert(from.data_ != 0 && from.dimension() == to.dimension());
            for(std::size_t j=0; j<from.dimension(); ++j) {
                Assert(from.shape(j) == to.shape(j));
            }
        }
        if(from.overlaps(to)) {
            Marray<TFrom, AFrom> m = from; // temporary copy
            execute(m, to);
        }
        else if(from.coordinateOrder() == to.coordinateOrder() 
                && from.isSimple() && to.isSimple()
                && IsEqual<TFrom, TTo>::type) {
            memcpy(to.data_, from.data_, (from.size())*sizeof(TFrom));
        }
        else if(from.dimension() == 1)
            OperateHelperBinary<1, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 2)
            OperateHelperBinary<2, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 3)
            OperateHelperBinary<3, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 4)
            OperateHelperBinary<4, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 5)
            OperateHelperBinary<5, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 6)
            OperateHelperBinary<6, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 7)
            OperateHelperBinary<7, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 8)
            OperateHelperBinary<8, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 9)
            OperateHelperBinary<9, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 10)
            OperateHelperBinary<10, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else {
            FromIterator itFrom = from.begin();
            ToIterator itTo = to.begin();
            for(; itFrom.hasMore(); ++itFrom, ++itTo) {
                *itTo = static_cast<TTo>(*itFrom);
            }
        }
    }